

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::Skeleton::setZAxis(Skeleton *this,Vector3D *axis)

{
  double dVar1;
  double dVar2;
  undefined4 uVar3;
  Vector3D rot_axis;
  Vector3D local_48;
  Vector3D local_28;
  
  local_48.x = 0.0;
  local_48.y = 0.0;
  local_48.z = 1.0;
  Vector3D::normalize(axis);
  dVar1 = acos(axis->x * 0.0 + axis->y * 0.0 + axis->z);
  dVar2 = (double)ABS((float)dVar1);
  if (1e-05 < dVar2) {
    cross(axis,&local_48);
    uVar3 = (undefined4)((ulong)dVar2 >> 0x20);
    Vector3D::normalize(&local_28);
    glRotatef(((float)dVar1 * -180.0) / 3.1415927,CONCAT44(uVar3,(float)local_28.x),
              (float)local_28.y,(float)local_28.z);
  }
  return;
}

Assistant:

void Skeleton::setZAxis(Vector3D axis)
  {
    Vector3D zAxis(0., 0., 1.);
    axis.normalize();
    float rot_angle = acos(dot(axis, zAxis));
    if (fabs(rot_angle) > 10E-6)
    {
      rot_angle = -rot_angle * 180 / M_PI;
      Vector3D rot_axis = cross(axis, zAxis);
      rot_axis.normalize();
      glRotatef(rot_angle, rot_axis.x, rot_axis.y, rot_axis.z);
    }
  }